

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.h
# Opt level: O1

void __thiscall
draco::Mesh::SetAttribute
          (Mesh *this,int att_id,
          unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> *pa)

{
  pointer *__ptr;
  _Head_base<0UL,_draco::PointAttribute_*,_false> local_18;
  
  local_18._M_head_impl =
       (pa->_M_t).
       super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>.
       _M_t.
       super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>.
       super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl;
  (pa->_M_t).
  super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>._M_t.
  super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>.
  super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl = (PointAttribute *)0x0;
  PointCloud::SetAttribute
            (&this->super_PointCloud,att_id,
             (unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> *)
             &local_18);
  if (local_18._M_head_impl != (PointAttribute *)0x0) {
    std::default_delete<draco::PointAttribute>::operator()
              ((default_delete<draco::PointAttribute> *)&local_18,local_18._M_head_impl);
  }
  local_18._M_head_impl = (PointAttribute *)0x0;
  if ((int)((ulong)((long)(this->attribute_data_).
                          super__Vector_base<draco::Mesh::AttributeData,_std::allocator<draco::Mesh::AttributeData>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->attribute_data_).
                         super__Vector_base<draco::Mesh::AttributeData,_std::allocator<draco::Mesh::AttributeData>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 2) <= att_id) {
    std::vector<draco::Mesh::AttributeData,_std::allocator<draco::Mesh::AttributeData>_>::resize
              (&this->attribute_data_,(long)(att_id + 1));
  }
  return;
}

Assistant:

void SetAttribute(int att_id, std::unique_ptr<PointAttribute> pa) override {
    PointCloud::SetAttribute(att_id, std::move(pa));
    if (static_cast<int>(attribute_data_.size()) <= att_id) {
      attribute_data_.resize(att_id + 1);
    }
  }